

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

string * __thiscall
cmMakefile::GetModulesFile_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefile *this,char *filename)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  PolicyStatus PVar6;
  char *pcVar7;
  size_t sVar8;
  char *__s1;
  long *plVar9;
  ostream *poVar10;
  PolicyID id;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string moduleInCMakeRoot;
  string moduleInCMakeModulePath;
  string itempl;
  undefined1 local_238 [24];
  long lStack_220;
  string local_210;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  char *local_1c8;
  long local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_1c8 = &local_1b8;
  local_1c0 = 0;
  local_1b8 = '\0';
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MODULE_PATH","");
  pcVar7 = GetDefinition(this,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar7 != (char *)0x0) {
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = (pointer)0x0;
    local_1a8._0_8_ = pcVar1;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar8);
    cmSystemTools::ExpandListArgument
              ((string *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_238,false);
    if ((char *)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_238._0_8_ != local_238._8_8_) {
      pbVar11 = (pointer)local_238._0_8_;
      do {
        while( true ) {
          pcVar2 = (pbVar11->_M_dataplus)._M_p;
          local_1a8._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar11->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_1a8);
          std::__cxx11::string::append((char *)local_1a8);
          std::__cxx11::string::append((char *)local_1a8);
          bVar4 = cmsys::SystemTools::FileExists((char *)local_1a8._0_8_);
          if (!bVar4) break;
          std::__cxx11::string::_M_assign((string *)&local_1c8);
          if ((char *)local_1a8._0_8_ != pcVar1) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar11 = pbVar11 + 1;
          if (bVar4 || pbVar11 == (pointer)local_238._8_8_) goto LAB_002d8939;
        }
        if ((char *)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != (pointer)local_238._8_8_);
    }
LAB_002d8939:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_ROOT","");
  pcVar7 = GetDefinition(this,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  sVar3 = local_210._M_string_length;
  if (pcVar7 != (char *)0x0) {
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)sVar3,(ulong)pcVar7);
    std::__cxx11::string::append((char *)&local_210);
    std::__cxx11::string::append((char *)&local_210);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_210);
    bVar4 = cmsys::SystemTools::FileExists(local_210._M_dataplus._M_p);
    if (!bVar4) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_210,0,(char *)local_210._M_string_length,0x53c2a5);
    }
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((local_1c0 == 0) || ((char *)local_210._M_string_length == (char *)0x0)) goto LAB_002d8d09;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_CURRENT_LIST_FILE","");
  __s1 = GetDefinition(this,(string *)local_1a8);
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"/Modules/","");
  strlen(pcVar7);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)pcVar7);
  pbVar11 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pbVar11) {
    local_238._16_8_ = (pbVar11->_M_dataplus)._M_p;
    lStack_220 = plVar9[3];
    local_238._0_8_ = (pointer)(local_238 + 0x10);
  }
  else {
    local_238._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_238._0_8_ = (pointer)*plVar9;
  }
  local_238._8_8_ = plVar9[1];
  *plVar9 = (long)pbVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((char *)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((__s1 != (char *)0x0) &&
     (iVar5 = strncmp(__s1,(char *)local_238._0_8_,local_238._8_8_), iVar5 == 0)) {
    PVar6 = GetPolicyStatus(this,CMP0017);
    if ((2 < PVar6 - NEW) && (PVar6 != OLD)) {
      if (PVar6 != WARN) goto LAB_002d8cf2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"File ",5);
      sVar8 = strlen(__s1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s1,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," includes ",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,local_1c8,local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," (found via CMAKE_MODULE_PATH) which shadows ",0x2d);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_210._M_dataplus._M_p,local_210._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,". This may cause errors later on .\n",0x23);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0x11,id);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
LAB_002d8cf2:
  if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
    operator_delete((void *)local_238._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_238._16_8_)->_M_p + 1));
  }
LAB_002d8d09:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const char* filename) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if(cmakeModulePath)
    {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    //Look through the possible module directories.
    for(std::vector<std::string>::iterator i = modulePath.begin();
        i != modulePath.end(); ++i)
      {
      std::string itempl = *i;
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if(cmSystemTools::FileExists(itempl.c_str()))
        {
        moduleInCMakeModulePath = itempl;
        break;
        }
      }
    }

  // Always search in the standard modules location.
  const char* cmakeRoot = this->GetDefinition("CMAKE_ROOT");
  if(cmakeRoot)
    {
    moduleInCMakeRoot = cmakeRoot;
    moduleInCMakeRoot += "/Modules/";
    moduleInCMakeRoot += filename;
    cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
    if(!cmSystemTools::FileExists(moduleInCMakeRoot.c_str()))
      {
      moduleInCMakeRoot = "";
      }
    }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  result = moduleInCMakeModulePath;
  if (result.empty())
    {
    result = moduleInCMakeRoot;
    }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty())
    {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmakeRoot + std::string("/Modules/");
    if (currentFile && strncmp(currentFile, mods.c_str(), mods.size()) == 0)
      {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017))
        {
        case cmPolicies::WARN:
        {
          std::ostringstream e;
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
           // break;  // fall through to OLD behaviour
        }
        case cmPolicies::OLD:
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          result = moduleInCMakeRoot;
          break;
        }
      }
    }

  return result;
}